

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

void __thiscall
Js::LineOffsetCache::LineOffsetCache
          (LineOffsetCache *this,Recycler *allocator,LPCUTF8 sourceStartCharacter,
          LPCUTF8 sourceEndCharacter,charcount_t startingCharacterOffset,
          charcount_t startingByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  nullptr_t local_40;
  nullptr_t local_38;
  charcount_t local_30;
  charcount_t local_2c;
  charcount_t startingByteOffset_local;
  charcount_t startingCharacterOffset_local;
  LPCUTF8 sourceEndCharacter_local;
  LPCUTF8 sourceStartCharacter_local;
  Recycler *allocator_local;
  LineOffsetCache *this_local;
  
  local_38 = (nullptr_t)0x0;
  local_30 = startingByteOffset;
  local_2c = startingCharacterOffset;
  _startingByteOffset_local = sourceEndCharacter;
  sourceEndCharacter_local = sourceStartCharacter;
  sourceStartCharacter_local = (LPCUTF8)allocator;
  allocator_local = (Recycler *)this;
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  WriteBarrierPtr(&this->lineCharacterOffsetCacheList,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>::
  WriteBarrierPtr(&this->lineByteOffsetCacheList,&local_40);
  if (sourceStartCharacter_local == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x23,"(allocator)",
                                "An allocator must be supplied to the cache for allocation of items."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  BuildCache(this,(Recycler *)sourceStartCharacter_local,sourceEndCharacter_local,
             _startingByteOffset_local,local_2c,local_30);
  return;
}

Assistant:

LineOffsetCache::LineOffsetCache(Recycler* allocator,
        _In_z_ LPCUTF8 sourceStartCharacter,
        _In_z_ LPCUTF8 sourceEndCharacter,
        charcount_t startingCharacterOffset,
        charcount_t startingByteOffset) :
        lineCharacterOffsetCacheList(nullptr),
        lineByteOffsetCacheList(nullptr)
    {
        AssertMsg(allocator, "An allocator must be supplied to the cache for allocation of items.");
        this->BuildCache(allocator, sourceStartCharacter, sourceEndCharacter, startingCharacterOffset, startingByteOffset);
    }